

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O0

void __thiscall
Gluco::OccLists<int,_Gluco::vec<unsigned_int>,_Gluco::SimpSolver::ClauseDeleted>::clear
          (OccLists<int,_Gluco::vec<unsigned_int>,_Gluco::SimpSolver::ClauseDeleted> *this,bool free
          )

{
  bool free_local;
  OccLists<int,_Gluco::vec<unsigned_int>,_Gluco::SimpSolver::ClauseDeleted> *this_local;
  
  vec<Gluco::vec<unsigned_int>_>::clear(&this->occs,free);
  vec<char>::clear(&this->dirty,free);
  vec<int>::clear(&this->dirties,free);
  return;
}

Assistant:

void  clear(bool free = true){
        occs   .clear(free);
        dirty  .clear(free);
        dirties.clear(free);
    }